

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O3

void __thiscall Rml::ElementDocument::ProcessDefaultAction(ElementDocument *this,Event *event)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  CanFocus CVar4;
  Element *pEVar5;
  ComputedValues *pCVar6;
  ElementDocument *element;
  Property *property;
  NavigationSearchDirection direction;
  PropertyId id;
  ElementDocument *this_00;
  ScrollIntoViewOptions options;
  uint local_4c;
  String local_48;
  
  Element::ProcessDefaultAction(&this->super_Element,event);
  bVar2 = Event::operator==(event,Keydown);
  if (!bVar2) {
    return;
  }
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"key_identifier","");
  local_4c = 0;
  iVar3 = Event::GetParameter<int>(event,&local_48,(int *)&local_4c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (iVar3 < 0x48) {
    if ((iVar3 == 1) || (iVar3 == 0x3d)) {
LAB_00226bd6:
      pEVar5 = Element::GetFocusLeafNode(&this->super_Element);
      if (pEVar5 == (Element *)0x0) {
        return;
      }
      pCVar6 = Element::GetComputedValues(pEVar5);
      if (((pCVar6->rare).field_0x2 & 0x80) == 0) {
        return;
      }
      Element::Click(pEVar5);
      goto LAB_00226ca8;
    }
    if (iVar3 != 0x46) {
      return;
    }
    pEVar5 = Event::GetTargetElement(event);
    local_48._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"shift_key","");
    local_4c = local_4c & 0xffffff00;
    bVar2 = Event::GetParameter<bool>(event,&local_48,(bool *)&local_4c);
    pEVar5 = FindNextTabElement(this,pEVar5,!bVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    switch(iVar3) {
    case 0x5a:
      direction = Left;
      id = NavLeft;
      break;
    case 0x5b:
      direction = Up;
      id = NavUp;
      break;
    case 0x5c:
      direction = Right;
      id = NavRight;
      break;
    case 0x5d:
      direction = Down;
      id = NavDown;
      break;
    default:
      if (iVar3 != 0x48) {
        return;
      }
      goto LAB_00226bd6;
    }
    element = (ElementDocument *)Element::GetFocusLeafNode(&this->super_Element);
    while ((this_00 = this, element != (ElementDocument *)0x0 &&
           (CVar4 = anon_unknown_0::CanFocusElement(&element->super_Element), this_00 = element,
           CVar4 != Yes))) {
      element = (ElementDocument *)Element::GetParentNode(&element->super_Element);
    }
    property = Element::GetLocalProperty(&this_00->super_Element,id);
    if (property == (Property *)0x0) {
      return;
    }
    pEVar5 = FindNextNavigationElement(this,&this_00->super_Element,direction,property);
  }
  if (pEVar5 == (Element *)0x0) {
    return;
  }
  bVar2 = Element::Focus(pEVar5,true);
  if (!bVar2) {
    return;
  }
  options.behavior = Instant;
  options.parentage = All;
  options.vertical = Nearest;
  options.horizontal = Nearest;
  Element::ScrollIntoView(pEVar5,options);
LAB_00226ca8:
  Event::StopPropagation(event);
  return;
}

Assistant:

void ElementDocument::ProcessDefaultAction(Event& event)
{
	Element::ProcessDefaultAction(event);

	// Process generic keyboard events for this window in bubble phase
	if (event == EventId::Keydown)
	{
		int key_identifier = event.GetParameter<int>("key_identifier", Input::KI_UNKNOWN);

		// Process TAB
		if (key_identifier == Input::KI_TAB)
		{
			if (Element* element = FindNextTabElement(event.GetTargetElement(), !event.GetParameter<bool>("shift_key", false)))
			{
				if (element->Focus(true))
				{
					element->ScrollIntoView(ScrollAlignment::Nearest);
					event.StopPropagation();
				}
			}
		}
		// Process direction keys
		else if (key_identifier == Input::KI_LEFT || key_identifier == Input::KI_RIGHT || key_identifier == Input::KI_UP ||
			key_identifier == Input::KI_DOWN)
		{
			NavigationSearchDirection direction = {};
			PropertyId property_id = PropertyId::NavLeft;
			switch (key_identifier)
			{
			case Input::KI_LEFT:
				direction = NavigationSearchDirection::Left;
				property_id = PropertyId::NavLeft;
				break;
			case Input::KI_RIGHT:
				direction = NavigationSearchDirection::Right;
				property_id = PropertyId::NavRight;
				break;
			case Input::KI_UP:
				direction = NavigationSearchDirection::Up;
				property_id = PropertyId::NavUp;
				break;
			case Input::KI_DOWN:
				direction = NavigationSearchDirection::Down;
				property_id = PropertyId::NavDown;
				break;
			}

			auto GetNearestFocusable = [this](Element* focus_node) -> Element* {
				while (focus_node)
				{
					if (CanFocusElement(focus_node) == CanFocus::Yes)
						break;
					focus_node = focus_node->GetParentNode();
				}
				return focus_node ? focus_node : this;
			};
			Element* focus_node = GetNearestFocusable(GetFocusLeafNode());
			if (const Property* nav_property = focus_node->GetLocalProperty(property_id))
			{
				if (Element* next = FindNextNavigationElement(focus_node, direction, *nav_property))
				{
					if (next->Focus(true))
					{
						next->ScrollIntoView(ScrollAlignment::Nearest);
						event.StopPropagation();
					}
				}
			}
		}
		// Process ENTER being pressed on a focusable object (emulate click)
		else if (key_identifier == Input::KI_RETURN || key_identifier == Input::KI_NUMPADENTER || key_identifier == Input::KI_SPACE)
		{
			Element* focus_node = GetFocusLeafNode();

			if (focus_node && focus_node->GetComputedValues().tab_index() == Style::TabIndex::Auto)
			{
				focus_node->Click();
				event.StopPropagation();
			}
		}
	}
}